

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead80pq.c
# Opt level: O1

size_t ascon_aead80pq_decrypt_final
                 (ascon_aead_ctx_t *ctx,uint8_t *plaintext,_Bool *is_tag_valid,uint8_t *expected_tag
                 ,size_t expected_tag_len)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  _Bool _Var9;
  uint64_t uVar10;
  uint64_t uVar11;
  undefined1 auVar12 [16];
  
  if ((ctx->bufstate).flow_state != '\x06') {
    ascon_aead128_80pq_finalise_assoc_data(ctx);
  }
  uVar10 = bigendian_decode_varlen((ctx->bufstate).buffer,(ctx->bufstate).buffer_len);
  bigendian_encode_varlen(plaintext,(ctx->bufstate).sponge.x0 ^ uVar10,(ctx->bufstate).buffer_len);
  uVar11 = mask_most_signif_bytes((ctx->bufstate).buffer_len);
  bVar3 = (ctx->bufstate).buffer_len;
  (ctx->bufstate).sponge.x0 =
       0x80L << ((ulong)(byte)(bVar3 * -8 + 0x38) & 0x3f) ^
       (~uVar11 & (ctx->bufstate).sponge.x0 | uVar10);
  uVar10 = ctx->k2;
  auVar12._0_8_ = ctx->k1;
  auVar12._8_8_ = ctx->k2;
  auVar4 = vpmovsxbd_avx(ZEXT416(0x6030401));
  auVar2._0_8_ = ctx->k0;
  auVar2._8_8_ = ctx->k1;
  auVar12 = vpermi2d_avx512vl(auVar4,auVar12,auVar2);
  auVar4._0_8_ = (ctx->bufstate).sponge.x1;
  auVar4._8_8_ = (ctx->bufstate).sponge.x2;
  (ctx->bufstate).sponge.x1 = SUB168(auVar12 ^ auVar4,0);
  (ctx->bufstate).sponge.x2 = SUB168(auVar12 ^ auVar4,8);
  puVar1 = &(ctx->bufstate).sponge.x3;
  *puVar1 = *puVar1 ^ uVar10 << 0x20;
  ascon_permutation_12((ascon_sponge_t *)ctx);
  uVar5 = *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4);
  uVar10 = (ctx->bufstate).sponge.x4;
  uVar6 = *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4);
  uVar7 = *(uint *)((long)&ctx->k1 + 4);
  uVar11 = ctx->k2;
  uVar8 = *(uint *)((long)&ctx->k2 + 4);
  *(uint *)&(ctx->bufstate).sponge.x3 = (uint)(ctx->bufstate).sponge.x3 ^ (uint)ctx->k1;
  *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4) = uVar5 ^ uVar7;
  *(uint *)&(ctx->bufstate).sponge.x4 = (uint)uVar10 ^ (uint)uVar11;
  *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4) = uVar6 ^ uVar8;
  _Var9 = ascon_aead_is_tag_valid(ctx,expected_tag,expected_tag_len);
  *is_tag_valid = _Var9;
  ascon_aead_cleanup(ctx);
  return (ulong)bVar3;
}

Assistant:

ASCON_API size_t
ascon_aead80pq_decrypt_final(ascon_aead_ctx_t* const ctx,
                             uint8_t* plaintext,
                             bool* const is_tag_valid,
                             const uint8_t* const expected_tag,
                             const size_t expected_tag_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(plaintext != NULL);
    ASCON_ASSERT(expected_tag_len == 0 || expected_tag != NULL);
    ASCON_ASSERT(is_tag_valid != NULL);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128_80pq_DECRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_aead128_80pq_finalise_assoc_data(ctx);
    }
    size_t freshly_generated_plaintext_len = 0;
    // If there is any remaining less-than-a-block ciphertext to be absorbed
    // cached in the buffer, pad it and absorb it.
    // Absorb ciphertext in buffer
    const uint64_t c_0 = bigendian_decode_varlen(ctx->bufstate.buffer,
                                                 ctx->bufstate.buffer_len);
    // Squeeze out last plaintext bytes
    bigendian_encode_varlen(plaintext, ctx->bufstate.sponge.x0 ^ c_0,
                            ctx->bufstate.buffer_len);
    // Final state changes at decryption's end
    ctx->bufstate.sponge.x0 &= ~mask_most_signif_bytes(ctx->bufstate.buffer_len);
    ctx->bufstate.sponge.x0 |= c_0;
    ctx->bufstate.sponge.x0 ^= PADDING(ctx->bufstate.buffer_len);
    freshly_generated_plaintext_len += ctx->bufstate.buffer_len;
    // End of decryption, start of tag validation.
    // Apply key twice more with a permutation to set the state for the tag.
    ctx->bufstate.sponge.x1 ^= ctx->k0 << 32U | ctx->k1 >> 32U;
    ctx->bufstate.sponge.x2 ^= ctx->k1 << 32U | ctx->k2 >> 32U;
    ctx->bufstate.sponge.x3 ^= ctx->k2 << 32U;
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k1;
    ctx->bufstate.sponge.x4 ^= ctx->k2;
    // Validate tag with variable len
    *is_tag_valid = ascon_aead_is_tag_valid(ctx, expected_tag, expected_tag_len);
    // Final security cleanup of the internal state and key.
    ascon_aead_cleanup(ctx);
    return freshly_generated_plaintext_len;
}